

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.cpp
# Opt level: O0

void __thiscall antlr::RecognitionException::RecognitionException(RecognitionException *this)

{
  ANTLRException *in_RDI;
  string *in_stack_ffffffffffffffa8;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  ANTLRException::ANTLRException(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  in_RDI->_vptr_ANTLRException = (_func_int **)&PTR__RecognitionException_004fe5f8;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  *(undefined4 *)((long)&in_RDI[1].text.field_2 + 8) = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[1].text.field_2 + 0xc) = 0xffffffff;
  return;
}

Assistant:

RecognitionException::RecognitionException()
: ANTLRException("parsing error")
, line(-1)
, column(-1)
{
}